

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcItem *p)

{
  Schema *pSVar1;
  long lVar2;
  char **ppcVar3;
  Table *pTVar4;
  Schema **ppSVar5;
  
  if (p->pSchema == (Schema *)0x0) {
    ppcVar3 = &p->zDatabase;
  }
  else {
    lVar2 = -0x100000000;
    ppSVar5 = &pParse->db->aDb->pSchema;
    do {
      lVar2 = lVar2 + 0x100000000;
      pSVar1 = *ppSVar5;
      ppSVar5 = ppSVar5 + 4;
    } while (pSVar1 != p->pSchema);
    ppcVar3 = (char **)((long)&pParse->db->aDb->zDbSName + (lVar2 >> 0x1b));
  }
  pTVar4 = sqlite3LocateTable(pParse,flags,p->zName,*ppcVar3);
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse,
  u32 flags,
  SrcItem *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}